

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void __thiscall
RPCArg::RPCArg(RPCArg *this,string name,Type type,Fallback fallback,string description,
              RPCArgOptions opts)

{
  size_type *psVar1;
  undefined2 uVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pbVar5;
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_RCX;
  Type in_EDX;
  undefined4 in_register_00000034;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *in_R8;
  undefined1 *in_R9;
  long in_FS_OFFSET;
  bool local_39;
  long local_38;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar7 = &(this->m_names).field_2;
  (this->m_names)._M_dataplus._M_p = (pointer)paVar7;
  psVar1 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar1) {
    lVar3 = plVar6[3];
    paVar7->_M_allocated_capacity = *psVar1;
    *(long *)((long)&(this->m_names).field_2 + 8) = lVar3;
  }
  else {
    (this->m_names)._M_dataplus._M_p = (pointer)*plVar6;
    (this->m_names).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_names)._M_string_length = plVar6[1];
  *plVar6 = (long)psVar1;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  this->m_type = in_EDX;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__detail::__variant::
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::_Move_ctor_base((_Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                     *)&this->m_fallback,in_RCX);
  paVar7 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)paVar7;
  psVar1 = (size_type *)(in_R8 + 2);
  if ((size_type *)*in_R8 == psVar1) {
    lVar3 = in_R8[3];
    paVar7->_M_allocated_capacity = *psVar1;
    *(long *)((long)&(this->m_description).field_2 + 8) = lVar3;
  }
  else {
    (this->m_description)._M_dataplus._M_p = (pointer)*in_R8;
    (this->m_description).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_description)._M_string_length = in_R8[1];
  *in_R8 = (long)psVar1;
  in_R8[1] = 0;
  *(undefined1 *)(in_R8 + 2) = 0;
  (this->m_opts).skip_type_check = (bool)*in_R9;
  paVar7 = &(this->m_opts).oneline_description.field_2;
  (this->m_opts).oneline_description._M_dataplus._M_p = (pointer)paVar7;
  psVar1 = (size_type *)(in_R9 + 0x18);
  if (*(size_type **)(in_R9 + 8) == psVar1) {
    uVar4 = *(undefined8 *)(in_R9 + 0x20);
    paVar7->_M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&(this->m_opts).oneline_description.field_2 + 8) = uVar4;
  }
  else {
    (this->m_opts).oneline_description._M_dataplus._M_p = (pointer)*(size_type **)(in_R9 + 8);
    (this->m_opts).oneline_description.field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_opts).oneline_description._M_string_length = *(size_type *)(in_R9 + 0x10);
  *(size_type **)(in_R9 + 8) = psVar1;
  local_39 = false;
  *(undefined8 *)(in_R9 + 0x10) = 0;
  in_R9[0x18] = 0;
  pbVar5 = *(pointer *)(in_R9 + 0x30);
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(in_R9 + 0x28);
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->m_opts).type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(in_R9 + 0x38);
  *(undefined8 *)(in_R9 + 0x38) = 0;
  *(undefined8 *)(in_R9 + 0x28) = 0;
  *(undefined8 *)(in_R9 + 0x30) = 0;
  uVar2 = *(undefined2 *)(in_R9 + 0x40);
  (this->m_opts).hidden = (bool)(char)uVar2;
  (this->m_opts).also_positional = (bool)(char)((ushort)uVar2 >> 8);
  if ((OBJ_NAMED_PARAMS < in_EDX) || ((0x23U >> (in_EDX & 0x1f) & 1) == 0)) {
    local_39 = in_EDX != OBJ_USER_KEYS;
  }
  inline_check_non_fatal<bool>
            (&local_39,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.h"
             ,0xe6,"RPCArg",
             "type != Type::ARR && type != Type::OBJ && type != Type::OBJ_NAMED_PARAMS && type != Type::OBJ_USER_KEYS"
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCArg(
        std::string name,
        Type type,
        Fallback fallback,
        std::string description,
        RPCArgOptions opts = {})
        : m_names{std::move(name)},
          m_type{std::move(type)},
          m_fallback{std::move(fallback)},
          m_description{std::move(description)},
          m_opts{std::move(opts)}
    {
        CHECK_NONFATAL(type != Type::ARR && type != Type::OBJ && type != Type::OBJ_NAMED_PARAMS && type != Type::OBJ_USER_KEYS);
    }